

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int combine_delete_insn(gen_ctx_t gen_ctx,MIR_insn_t def_insn,bb_insn_t_conflict bb_insn)

{
  dead_var_t_conflict *ppdVar1;
  char cVar2;
  uint uVar3;
  MIR_reg_t MVar4;
  uint uVar5;
  combine_ctx *pcVar6;
  dead_var_t pdVar7;
  dead_var_t_conflict pdVar8;
  dead_var_t pdVar9;
  void *pvVar10;
  MIR_insn_t_conflict insn;
  bool bVar11;
  int iVar12;
  DLIST_LINK_dead_var_t *pDVar13;
  ulong uVar14;
  ulong uVar15;
  DLIST_dead_var_t *pDVar16;
  dead_var_t *ppdVar17;
  dead_var_t *ppdVar18;
  dead_var_t_conflict pdVar19;
  bb_insn_t_conflict pbVar20;
  ulong nop;
  int out_p;
  int local_64;
  DLIST_dead_var_t *local_60;
  bb_insn_t_conflict local_58;
  dead_var_t_conflict local_50;
  long local_48;
  DLIST_LINK_dead_var_t *local_40;
  dead_var_t *local_38;
  
  if (def_insn->ops[0].field_0x8 != '\x02') {
LAB_00173dc0:
    __assert_fail("def_insn->ops[0].mode == MIR_OP_VAR",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2214,"int combine_delete_insn(gen_ctx_t, MIR_insn_t, bb_insn_t)");
  }
  uVar3 = def_insn->ops[0].u.reg;
  uVar15 = (ulong)uVar3;
  pcVar6 = gen_ctx->combine_ctx;
  iVar12 = 0;
  if ((pcVar6->var_ref_ages_addr[uVar15] == pcVar6->curr_bb_var_ref_age) &&
     (local_48 = uVar15 * 0x20, iVar12 = 0, pcVar6->var_refs_addr[uVar15].del_p == '\0')) {
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("      deleting now dead insn ",0x1d,1,(FILE *)gen_ctx->debug_file);
      print_bb_insn(gen_ctx,(bb_insn_t_conflict)def_insn->data,1);
    }
    if (uVar3 == 0xffffffff) goto LAB_00173dee;
    local_60 = &bb_insn->insn_dead_vars;
    pdVar19 = (bb_insn->insn_dead_vars).head;
    if (pdVar19 != (dead_var_t_conflict)0x0) {
      ppdVar1 = &(bb_insn->insn_dead_vars).tail;
      do {
        pdVar7 = (pdVar19->dead_var_link).next;
        if (pdVar19->var == uVar3) {
          pdVar8 = (pdVar19->dead_var_link).prev;
          if (pdVar8 == (dead_var_t_conflict)0x0) {
            pDVar16 = local_60;
            if (local_60->head == pdVar19) goto LAB_00173b88;
            combine_delete_insn_cold_1();
LAB_00173de4:
            combine_delete_insn_cold_2();
            goto LAB_00173de9;
          }
          pDVar16 = (DLIST_dead_var_t *)&(pdVar8->dead_var_link).next;
LAB_00173b88:
          pDVar16->head = pdVar7;
          pdVar9 = (pdVar19->dead_var_link).next;
          if (pdVar9 == (dead_var_t)0x0) {
            pDVar13 = (DLIST_LINK_dead_var_t *)ppdVar1;
            if (*ppdVar1 != pdVar19) goto LAB_00173de4;
          }
          else {
            pDVar13 = &pdVar9->dead_var_link;
          }
          pDVar13->prev = pdVar8;
          (pdVar19->dead_var_link).prev = (dead_var_t)0x0;
          (pdVar19->dead_var_link).next = (dead_var_t)0x0;
          free_dead_var(gen_ctx,pdVar19);
        }
        pdVar19 = pdVar7;
      } while (pdVar7 != (dead_var_t)0x0);
    }
    pvVar10 = def_insn->data;
    pdVar19 = *(dead_var_t_conflict *)((long)pvVar10 + 0x38);
    if (pdVar19 != (dead_var_t_conflict)0x0) {
      ppdVar18 = (dead_var_t *)((long)pvVar10 + 0x38);
      local_40 = (DLIST_LINK_dead_var_t *)((long)pvVar10 + 0x40);
      local_58 = bb_insn;
      local_38 = ppdVar18;
      do {
        pdVar7 = (pdVar19->dead_var_link).prev;
        ppdVar17 = &(pdVar7->dead_var_link).next;
        if (pdVar7 == (dead_var_t)0x0) {
          ppdVar17 = ppdVar18;
        }
        *ppdVar17 = (pdVar19->dead_var_link).next;
        pdVar9 = (pdVar19->dead_var_link).next;
        if (pdVar9 == (dead_var_t)0x0) {
          pDVar13 = local_40;
          if (local_40->prev == pdVar19) goto LAB_00173c2f;
          combine_delete_insn_cold_3();
LAB_00173dbb:
          combine_delete_insn_cold_4();
          goto LAB_00173dc0;
        }
        pDVar13 = &pdVar9->dead_var_link;
LAB_00173c2f:
        pDVar13->prev = pdVar7;
        (pdVar19->dead_var_link).prev = (dead_var_t)0x0;
        (pdVar19->dead_var_link).next = (dead_var_t)0x0;
        MVar4 = pdVar19->var;
        insn = local_58->insn;
        uVar3 = *(uint *)&insn->field_0x1c;
        uVar15 = 0;
        nop = 0;
        pbVar20 = local_58;
        local_50 = pdVar19;
        do {
          bVar11 = true;
          uVar14 = uVar15;
          if (nop < uVar3) {
            do {
              MIR_insn_op_mode(gen_ctx->ctx,insn,nop,&local_64);
              if ((local_64 == 0) || (uVar15 = uVar14, insn->ops[nop].field_0x8 == '\v')) {
                if (uVar14 < 2) {
                  cVar2 = insn->ops[nop].field_0x8;
                  while (cVar2 == '\v') {
                    uVar5 = *(uint *)((long)&insn->ops[nop].u + (ulong)(uVar14 != 0) * 4 + 0x10);
                    pbVar20 = (bb_insn_t_conflict)(ulong)uVar5;
                    if (uVar5 != 0xffffffff) goto LAB_00173cf1;
                    if (uVar14 != 0) goto LAB_00173cdb;
                    uVar14 = 1;
                  }
                  if (cVar2 == '\x02') {
                    uVar15 = 0;
                    if (uVar14 == 1) goto LAB_00173cdd;
                    pbVar20 = (bb_insn_t_conflict)(ulong)insn->ops[nop].u.reg;
LAB_00173cf1:
                    uVar15 = uVar14 + 1;
                    bVar11 = false;
                    goto LAB_00173cfd;
                  }
                }
LAB_00173cdb:
                uVar15 = 0;
              }
LAB_00173cdd:
              nop = nop + 1;
              uVar14 = uVar15;
            } while (nop != uVar3);
            bVar11 = true;
          }
LAB_00173cfd:
          ppdVar18 = local_38;
        } while ((!bVar11) && ((MIR_reg_t)pbVar20 != MVar4));
        if (bVar11) {
          free_dead_var(gen_ctx,local_50);
        }
        else {
          pdVar19 = (local_58->insn_dead_vars).tail;
          if (pdVar19 == (dead_var_t_conflict)0x0) {
            pDVar16 = local_60;
            if (local_60->head != (dead_var_t)0x0) goto LAB_00173de9;
          }
          else {
            if ((pdVar19->dead_var_link).next != (dead_var_t)0x0) goto LAB_00173dbb;
            pDVar16 = (DLIST_dead_var_t *)&(pdVar19->dead_var_link).next;
          }
          pDVar16->head = local_50;
          (local_50->dead_var_link).next = (dead_var_t)0x0;
          (local_50->dead_var_link).prev = pdVar19;
          (local_58->insn_dead_vars).tail = local_50;
        }
        pdVar19 = *ppdVar18;
      } while (pdVar19 != (dead_var_t)0x0);
    }
    gen_delete_insn(gen_ctx,def_insn);
    (&gen_ctx->combine_ctx->var_refs_addr->del_p)[local_48] = '\x01';
    iVar12 = 1;
  }
  return iVar12;
LAB_00173de9:
  combine_delete_insn_cold_5();
LAB_00173dee:
  __assert_fail("var != (4294967295U)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x222,"void remove_bb_insn_dead_var(gen_ctx_t, bb_insn_t, MIR_reg_t)");
}

Assistant:

static int combine_delete_insn (gen_ctx_t gen_ctx, MIR_insn_t def_insn, bb_insn_t bb_insn) {
  MIR_reg_t var;

  gen_assert (def_insn->ops[0].mode == MIR_OP_VAR);
  var = def_insn->ops[0].u.var;
  if (var_ref_ages_addr[var] != curr_bb_var_ref_age || var_refs_addr[var].del_p) return FALSE;
  DEBUG (2, {
    fprintf (debug_file, "      deleting now dead insn ");
    print_bb_insn (gen_ctx, def_insn->data, TRUE);
  });
  remove_bb_insn_dead_var (gen_ctx, bb_insn, var);
  move_bb_insn_dead_vars (gen_ctx, bb_insn, def_insn->data, hard_reg_used_in_bb_insn_p);
  /* We should delete the def insn here because of possible substitution of the def
     insn 'r0 = ... r0 ...'.  We still need valid entry for def here to find obsolete
     definiton, e.g. "r1 = r0; r0 = ...; r0 = ... (deleted); ...= ...r1..." */
  gen_delete_insn (gen_ctx, def_insn);
  var_refs_addr[var].del_p = TRUE; /* to exclude repetitive deletion */
  return TRUE;
}